

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O0

void rr::(anonymous_namespace)::
     readUnormOrder<unsigned_short,rr::(anonymous_namespace)::NormalOrder>
               (Vec4 *dst,int size,void *ptr)

{
  float *pfVar1;
  ushort local_2c;
  ushort local_2a;
  ushort local_28;
  ushort local_26;
  unsigned_short aligned [4];
  deUint32 range;
  void *ptr_local;
  int size_local;
  Vec4 *dst_local;
  
  aligned[0] = 0xffff;
  aligned[1] = 0;
  unique0x1000008c = ptr;
  ::deMemcpy(&local_2c,ptr,(long)size * 2);
  pfVar1 = tcu::Vector<float,_4>::operator[](dst,0);
  *pfVar1 = (float)local_2c / 65535.0;
  if (1 < size) {
    pfVar1 = tcu::Vector<float,_4>::operator[](dst,1);
    *pfVar1 = (float)local_2a / 65535.0;
  }
  if (2 < size) {
    pfVar1 = tcu::Vector<float,_4>::operator[](dst,2);
    *pfVar1 = (float)local_28 / 65535.0;
  }
  if (3 < size) {
    pfVar1 = tcu::Vector<float,_4>::operator[](dst,3);
    *pfVar1 = (float)local_26 / 65535.0;
  }
  return;
}

Assistant:

inline void readUnormOrder (tcu::Vec4& dst, const int size, const void* ptr)
{
	const deUint32 range = (deUint32)((1ull << (sizeof(SrcScalarType)*8))-1);

	SrcScalarType aligned[4];
	deMemcpy(aligned, ptr, size * sizeof(SrcScalarType));

				   dst[Order::T0] = float(aligned[0]) / float(range);
	if (size >= 2) dst[Order::T1] = float(aligned[1]) / float(range);
	if (size >= 3) dst[Order::T2] = float(aligned[2]) / float(range);
	if (size >= 4) dst[Order::T3] = float(aligned[3]) / float(range);
}